

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_log.c
# Opt level: O1

zt_log_level zt_log_set_level(zt_log_ty *log,zt_log_level level)

{
  zt_log_level zVar1;
  
  if ((log == (zt_log_ty *)0x0) && (log = zt_log_get_logger(), log == (zt_log_ty *)0x0)) {
    return zt_log_emerg;
  }
  zVar1 = log->level;
  log->level = level;
  return zVar1;
}

Assistant:

zt_log_level
zt_log_set_level(zt_log_ty * log, zt_log_level level) {
    zt_log_level olevel;

    if (!log && ((log = zt_log_get_logger()) == NULL)) {
        return 0;
    }

    olevel     = log->level;
    log->level = level;
    return olevel;
}